

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O3

void dlib::cpu::batch_normalize_conv
               (double eps,resizable_tensor *dest,resizable_tensor *means,resizable_tensor *invstds,
               double averaging_factor,resizable_tensor *running_means,
               resizable_tensor *running_variances,tensor *src,tensor *gamma,tensor *beta)

{
  int *piVar1;
  uint *puVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  double __x;
  undefined8 uVar17;
  byte bVar18;
  byte bVar19;
  resizable_tensor *prVar20;
  resizable_tensor *this;
  int iVar21;
  int iVar22;
  int iVar23;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar24;
  long lVar25;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  ulong uVar27;
  undefined4 extraout_var_14;
  ostream *poVar28;
  fatal_error *pfVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  size_t new_size;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  ushort uVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  float fVar49;
  double dVar50;
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  double dVar58;
  undefined8 in_XMM7_Qb;
  ostringstream dlib_o_out;
  string local_228;
  resizable_tensor *local_208;
  resizable_tensor *local_200;
  double local_1f8;
  resizable_tensor *local_1f0;
  resizable_tensor *local_1e8;
  double local_1e0;
  long *local_1d8;
  float local_1d0;
  long local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0 [44];
  string *local_50;
  float local_48;
  long **local_40;
  string **local_38;
  float *pfVar26;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  if ((averaging_factor < 0.0) || (1.0 < averaging_factor)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,"\n\nError detected at line ",0x19);
    poVar28 = (ostream *)std::ostream::operator<<((ostream *)&local_1c8,0x420);
    std::__ostream_insert<char,std::char_traits<char>>(poVar28,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,
               "void dlib::cpu::batch_normalize_conv(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
               ,0xd4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,"0 <= averaging_factor && averaging_factor <= 1",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,".\n",2);
    puVar2 = (uint *)((long)local_1b0 + *(long *)(local_1c8 + -0x18));
    *puVar2 = *puVar2 | 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,"averaging_factor: ",0x12);
    poVar28 = std::ostream::_M_insert<double>(averaging_factor);
    std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\n",1);
    pfVar29 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar29,EBROKEN_ASSERT,&local_228);
    __cxa_throw(pfVar29,&fatal_error::typeinfo,error::~error);
  }
  if ((averaging_factor != 1.0) || (NAN(averaging_factor))) {
    if (((running_means->super_tensor).m_n != (means->super_tensor).m_n) ||
       ((((running_means->super_tensor).m_k != (means->super_tensor).m_k ||
         ((running_means->super_tensor).m_nr != (means->super_tensor).m_nr)) ||
        ((running_means->super_tensor).m_nc != (means->super_tensor).m_nc)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,"\n\nError detected at line ",0x19);
      poVar28 = (ostream *)std::ostream::operator<<((ostream *)&local_1c8,0x421);
      std::__ostream_insert<char,std::char_traits<char>>(poVar28,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,"Error detected in file ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,"Error detected in function ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,
                 "void dlib::cpu::batch_normalize_conv(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                 ,0xd4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,".\n\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,"Failing expression was ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,
                 "averaging_factor==1 || have_same_dimensions(running_means,means)",0x40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,".\n",2);
      puVar2 = (uint *)((long)local_1b0 + *(long *)(local_1c8 + -0x18));
      *puVar2 = *puVar2 | 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"",0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"\n",1);
      pfVar29 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar29,EBROKEN_ASSERT,&local_228);
      __cxa_throw(pfVar29,&fatal_error::typeinfo,error::~error);
    }
    if ((((running_variances->super_tensor).m_n != (invstds->super_tensor).m_n) ||
        ((running_variances->super_tensor).m_k != (invstds->super_tensor).m_k)) ||
       (((running_variances->super_tensor).m_nr != (invstds->super_tensor).m_nr ||
        ((running_variances->super_tensor).m_nc != (invstds->super_tensor).m_nc)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,"\n\nError detected at line ",0x19);
      poVar28 = (ostream *)std::ostream::operator<<((ostream *)&local_1c8,0x422);
      std::__ostream_insert<char,std::char_traits<char>>(poVar28,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,"Error detected in file ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,"Error detected in function ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,
                 "void dlib::cpu::batch_normalize_conv(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                 ,0xd4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,".\n\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,"Failing expression was ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,
                 "averaging_factor==1 || have_same_dimensions(running_variances,invstds)",0x46);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,".\n",2);
      puVar2 = (uint *)((long)local_1b0 + *(long *)(local_1c8 + -0x18));
      *puVar2 = *puVar2 | 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"",0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"\n",1);
      pfVar29 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar29,EBROKEN_ASSERT,&local_228);
      __cxa_throw(pfVar29,&fatal_error::typeinfo,error::~error);
    }
  }
  auVar56._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])&beta->m_nr +
       ZEXT116(1) * *(undefined1 (*) [16])&gamma->m_nr;
  auVar56._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])&beta->m_nr;
  auVar42._8_8_ = 1;
  auVar42._0_8_ = 1;
  auVar42._16_8_ = 1;
  auVar42._24_8_ = 1;
  auVar42 = vpxorq_avx512vl(auVar56,auVar42);
  local_1f8 = eps;
  if (((auVar42 != (undefined1  [32])0x0) || (gamma->m_n != 1)) ||
     ((src->m_n < 2 ||
      ((((beta->m_n != 1 || (gamma->m_k != beta->m_k)) || (eps <= 0.0)) || (gamma->m_k != src->m_k))
      )))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,"\n\nError detected at line ",0x19);
    poVar28 = (ostream *)std::ostream::operator<<((ostream *)&local_1c8,0x439);
    std::__ostream_insert<char,std::char_traits<char>>(poVar28,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,
               "void dlib::cpu::batch_normalize_conv(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
               ,0xd4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,
               "src.num_samples() > 1 && gamma.num_samples() == 1 && beta.num_samples() == 1 && gamma.nr() == 1 && beta.nr() == 1 && gamma.nc() == 1 && beta.nc() == 1 && gamma.k() == beta.k() && beta.k() == src.k() && eps > 0"
               ,0xd1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,".\n",2);
    puVar2 = (uint *)((long)local_1b0 + *(long *)(local_1c8 + -0x18));
    *puVar2 = *puVar2 | 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,"\ngamma.num_samples(): ",0x16);
    poVar28 = std::ostream::_M_insert<long_long>((longlong)&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\ngamma.k():  ",0xd);
    poVar28 = std::ostream::_M_insert<long_long>((longlong)poVar28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\ngamma.nr(): ",0xd);
    poVar28 = std::ostream::_M_insert<long_long>((longlong)poVar28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\ngamma.nc(): ",0xd);
    poVar28 = std::ostream::_M_insert<long_long>((longlong)poVar28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\nbeta.num_samples(): ",0x15);
    poVar28 = std::ostream::_M_insert<long_long>((longlong)poVar28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\nbeta.k():   ",0xd);
    poVar28 = std::ostream::_M_insert<long_long>((longlong)poVar28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\nbeta.nr():  ",0xd);
    poVar28 = std::ostream::_M_insert<long_long>((longlong)poVar28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\nbeta.nc():  ",0xd);
    poVar28 = std::ostream::_M_insert<long_long>((longlong)poVar28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\nsrc.k():   ",0xc);
    poVar28 = std::ostream::_M_insert<long_long>((longlong)poVar28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\nsrc.nr():  ",0xc);
    poVar28 = std::ostream::_M_insert<long_long>((longlong)poVar28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\nsrc.nc():  ",0xc);
    poVar28 = std::ostream::_M_insert<long_long>((longlong)poVar28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\neps:  ",7);
    poVar28 = std::ostream::_M_insert<double>(local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar28,"\n",1);
    pfVar29 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar29,EBROKEN_ASSERT,&local_228);
    __cxa_throw(pfVar29,&fatal_error::typeinfo,error::~error);
  }
  local_1f0 = dest;
  resizable_tensor::copy_size(dest,src);
  new_size = src->m_k;
  (means->super_tensor).m_n = 1;
  (means->super_tensor).m_k = new_size;
  (means->super_tensor).m_nr = 1;
  (means->super_tensor).m_nc = 1;
  (means->super_tensor).m_size = new_size;
  if ((long)(means->data_instance).data_size < (long)new_size) {
    gpu_data::set_size(&means->data_instance,new_size);
    new_size = src->m_k;
  }
  (invstds->super_tensor).m_n = 1;
  (invstds->super_tensor).m_k = new_size;
  (invstds->super_tensor).m_nr = 1;
  (invstds->super_tensor).m_nc = 1;
  (invstds->super_tensor).m_size = new_size;
  if ((long)(invstds->data_instance).data_size < (long)new_size) {
    gpu_data::set_size(&invstds->data_instance,new_size);
  }
  iVar21 = (*(means->super_tensor)._vptr_tensor[4])(means);
  lVar38 = (means->super_tensor).m_size;
  if (lVar38 != 0) {
    memset((void *)CONCAT44(extraout_var,iVar21),0,lVar38 << 2);
  }
  local_200 = running_variances;
  local_1e8 = running_means;
  iVar21 = (*(invstds->super_tensor)._vptr_tensor[4])(invstds);
  lVar38 = (invstds->super_tensor).m_size;
  if (lVar38 != 0) {
    memset((void *)CONCAT44(extraout_var_00,iVar21),0,lVar38 << 2);
  }
  iVar21 = (*(invstds->super_tensor)._vptr_tensor[3])(invstds);
  lVar24 = CONCAT44(extraout_var_01,iVar21);
  iVar21 = (*(means->super_tensor)._vptr_tensor[3])(means);
  lVar25 = CONCAT44(extraout_var_02,iVar21);
  iVar21 = (*gamma->_vptr_tensor[2])(gamma);
  iVar22 = (*beta->_vptr_tensor[2])();
  iVar23 = (*src->_vptr_tensor[2])(src);
  pfVar26 = (float *)CONCAT44(extraout_var_05,iVar23);
  lVar38 = src->m_n;
  lVar32 = src->m_nc * src->m_nr;
  if (0 < lVar38) {
    lVar39 = src->m_k;
    lVar31 = 0;
    do {
      if (0 < lVar39) {
        lVar33 = 0;
        do {
          lVar34 = lVar32;
          if (0 < lVar32) {
            do {
              *(float *)(lVar25 + lVar33 * 4) = *pfVar26 + *(float *)(lVar25 + lVar33 * 4);
              fVar49 = *pfVar26;
              pfVar26 = pfVar26 + 1;
              lVar34 = lVar34 + -1;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)fVar49),ZEXT416((uint)fVar49),
                                        ZEXT416(*(uint *)(lVar24 + lVar33 * 4)));
              *(int *)(lVar24 + lVar33 * 4) = auVar52._0_4_;
            } while (lVar34 != 0);
          }
          lVar33 = lVar33 + 1;
        } while (lVar33 != lVar39);
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 != lVar38);
  }
  iVar23 = (*(means->super_tensor)._vptr_tensor[3])(means);
  lVar31 = CONCAT44(extraout_var_06,iVar23);
  local_208 = means;
  iVar23 = (*(means->super_tensor)._vptr_tensor[3])();
  lVar39 = CONCAT44(extraout_var_07,iVar23) + (local_208->super_tensor).m_size * 4;
  if (lVar31 != lVar39) {
    auVar43 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar52._0_4_ = 1.0 / (float)(lVar38 * lVar32);
    auVar52._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar45 = vpbroadcastq_avx512f();
    auVar45 = vpsrlq_avx512f(auVar45,2);
    uVar30 = 0;
    auVar46 = vbroadcastss_avx512f(auVar52);
    do {
      auVar47 = vpbroadcastq_avx512f();
      auVar48 = vporq_avx512f(auVar47,auVar43);
      auVar47 = vporq_avx512f(auVar47,auVar44);
      uVar17 = vpcmpuq_avx512f(auVar47,auVar45,2);
      bVar18 = (byte)uVar17;
      uVar17 = vpcmpuq_avx512f(auVar48,auVar45,2);
      bVar19 = (byte)uVar17;
      uVar41 = CONCAT11(bVar19,bVar18);
      piVar1 = (int *)(lVar31 + uVar30 * 4);
      auVar47._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * piVar1[1];
      auVar47._0_4_ = (uint)(bVar18 & 1) * *piVar1;
      auVar47._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * piVar1[2];
      auVar47._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * piVar1[3];
      auVar47._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * piVar1[4];
      auVar47._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * piVar1[5];
      auVar47._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * piVar1[6];
      auVar47._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * piVar1[7];
      auVar47._32_4_ = (uint)(bVar19 & 1) * piVar1[8];
      auVar47._36_4_ = (uint)(bVar19 >> 1 & 1) * piVar1[9];
      auVar47._40_4_ = (uint)(bVar19 >> 2 & 1) * piVar1[10];
      auVar47._44_4_ = (uint)(bVar19 >> 3 & 1) * piVar1[0xb];
      auVar47._48_4_ = (uint)(bVar19 >> 4 & 1) * piVar1[0xc];
      auVar47._52_4_ = (uint)(bVar19 >> 5 & 1) * piVar1[0xd];
      auVar47._56_4_ = (uint)(bVar19 >> 6 & 1) * piVar1[0xe];
      auVar47._60_4_ = (uint)(bVar19 >> 7) * piVar1[0xf];
      auVar47 = vmulps_avx512f(auVar46,auVar47);
      puVar2 = (uint *)(lVar31 + uVar30 * 4);
      bVar4 = (bool)((byte)(uVar41 >> 1) & 1);
      bVar5 = (bool)((byte)(uVar41 >> 2) & 1);
      bVar6 = (bool)((byte)(uVar41 >> 3) & 1);
      bVar7 = (bool)((byte)(uVar41 >> 4) & 1);
      bVar8 = (bool)((byte)(uVar41 >> 5) & 1);
      bVar9 = (bool)((byte)(uVar41 >> 6) & 1);
      bVar10 = (bool)((byte)(uVar41 >> 7) & 1);
      bVar11 = (bool)(bVar19 >> 1 & 1);
      bVar12 = (bool)(bVar19 >> 2 & 1);
      bVar13 = (bool)(bVar19 >> 3 & 1);
      bVar14 = (bool)(bVar19 >> 4 & 1);
      bVar15 = (bool)(bVar19 >> 5 & 1);
      bVar16 = (bool)(bVar19 >> 6 & 1);
      *puVar2 = (uint)(bVar18 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar18 & 1) * *puVar2;
      puVar2[1] = (uint)bVar4 * auVar47._4_4_ | (uint)!bVar4 * puVar2[1];
      puVar2[2] = (uint)bVar5 * auVar47._8_4_ | (uint)!bVar5 * puVar2[2];
      puVar2[3] = (uint)bVar6 * auVar47._12_4_ | (uint)!bVar6 * puVar2[3];
      puVar2[4] = (uint)bVar7 * auVar47._16_4_ | (uint)!bVar7 * puVar2[4];
      puVar2[5] = (uint)bVar8 * auVar47._20_4_ | (uint)!bVar8 * puVar2[5];
      puVar2[6] = (uint)bVar9 * auVar47._24_4_ | (uint)!bVar9 * puVar2[6];
      puVar2[7] = (uint)bVar10 * auVar47._28_4_ | (uint)!bVar10 * puVar2[7];
      puVar2[8] = (uint)(bVar19 & 1) * auVar47._32_4_ | (uint)!(bool)(bVar19 & 1) * puVar2[8];
      puVar2[9] = (uint)bVar11 * auVar47._36_4_ | (uint)!bVar11 * puVar2[9];
      puVar2[10] = (uint)bVar12 * auVar47._40_4_ | (uint)!bVar12 * puVar2[10];
      puVar2[0xb] = (uint)bVar13 * auVar47._44_4_ | (uint)!bVar13 * puVar2[0xb];
      puVar2[0xc] = (uint)bVar14 * auVar47._48_4_ | (uint)!bVar14 * puVar2[0xc];
      puVar2[0xd] = (uint)bVar15 * auVar47._52_4_ | (uint)!bVar15 * puVar2[0xd];
      puVar2[0xe] = (uint)bVar16 * auVar47._56_4_ | (uint)!bVar16 * puVar2[0xe];
      puVar2[0xf] = (uint)(bVar19 >> 7) * auVar47._60_4_ | (uint)!(bool)(bVar19 >> 7) * puVar2[0xf];
      uVar30 = uVar30 + 0x10;
    } while ((((lVar39 - lVar31) - 4U >> 2) + 0x10 & 0x7ffffffffffffff0) != uVar30);
  }
  lVar39 = src->m_n;
  iVar23 = (*(invstds->super_tensor)._vptr_tensor[3])();
  lVar31 = CONCAT44(extraout_var_08,iVar23);
  iVar23 = (*(invstds->super_tensor)._vptr_tensor[3])();
  lVar38 = CONCAT44(extraout_var_09,iVar23) + (invstds->super_tensor).m_size * 4;
  if (lVar31 != lVar38) {
    auVar43 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar54._0_4_ = 1.0 / (float)(lVar39 * lVar32);
    auVar54._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar45 = vpbroadcastq_avx512f();
    auVar45 = vpsrlq_avx512f(auVar45,2);
    uVar30 = 0;
    auVar46 = vbroadcastss_avx512f(auVar54);
    do {
      auVar47 = vpbroadcastq_avx512f();
      auVar48 = vporq_avx512f(auVar47,auVar43);
      auVar47 = vporq_avx512f(auVar47,auVar44);
      uVar17 = vpcmpuq_avx512f(auVar47,auVar45,2);
      bVar18 = (byte)uVar17;
      uVar17 = vpcmpuq_avx512f(auVar48,auVar45,2);
      bVar19 = (byte)uVar17;
      uVar41 = CONCAT11(bVar19,bVar18);
      piVar1 = (int *)(lVar31 + uVar30 * 4);
      auVar48._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * piVar1[1];
      auVar48._0_4_ = (uint)(bVar18 & 1) * *piVar1;
      auVar48._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * piVar1[2];
      auVar48._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * piVar1[3];
      auVar48._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * piVar1[4];
      auVar48._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * piVar1[5];
      auVar48._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * piVar1[6];
      auVar48._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * piVar1[7];
      auVar48._32_4_ = (uint)(bVar19 & 1) * piVar1[8];
      auVar48._36_4_ = (uint)(bVar19 >> 1 & 1) * piVar1[9];
      auVar48._40_4_ = (uint)(bVar19 >> 2 & 1) * piVar1[10];
      auVar48._44_4_ = (uint)(bVar19 >> 3 & 1) * piVar1[0xb];
      auVar48._48_4_ = (uint)(bVar19 >> 4 & 1) * piVar1[0xc];
      auVar48._52_4_ = (uint)(bVar19 >> 5 & 1) * piVar1[0xd];
      auVar48._56_4_ = (uint)(bVar19 >> 6 & 1) * piVar1[0xe];
      auVar48._60_4_ = (uint)(bVar19 >> 7) * piVar1[0xf];
      auVar47 = vmulps_avx512f(auVar46,auVar48);
      puVar2 = (uint *)(lVar31 + uVar30 * 4);
      bVar4 = (bool)((byte)(uVar41 >> 1) & 1);
      bVar5 = (bool)((byte)(uVar41 >> 2) & 1);
      bVar6 = (bool)((byte)(uVar41 >> 3) & 1);
      bVar7 = (bool)((byte)(uVar41 >> 4) & 1);
      bVar8 = (bool)((byte)(uVar41 >> 5) & 1);
      bVar9 = (bool)((byte)(uVar41 >> 6) & 1);
      bVar10 = (bool)((byte)(uVar41 >> 7) & 1);
      bVar11 = (bool)(bVar19 >> 1 & 1);
      bVar12 = (bool)(bVar19 >> 2 & 1);
      bVar13 = (bool)(bVar19 >> 3 & 1);
      bVar14 = (bool)(bVar19 >> 4 & 1);
      bVar15 = (bool)(bVar19 >> 5 & 1);
      bVar16 = (bool)(bVar19 >> 6 & 1);
      *puVar2 = (uint)(bVar18 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar18 & 1) * *puVar2;
      puVar2[1] = (uint)bVar4 * auVar47._4_4_ | (uint)!bVar4 * puVar2[1];
      puVar2[2] = (uint)bVar5 * auVar47._8_4_ | (uint)!bVar5 * puVar2[2];
      puVar2[3] = (uint)bVar6 * auVar47._12_4_ | (uint)!bVar6 * puVar2[3];
      puVar2[4] = (uint)bVar7 * auVar47._16_4_ | (uint)!bVar7 * puVar2[4];
      puVar2[5] = (uint)bVar8 * auVar47._20_4_ | (uint)!bVar8 * puVar2[5];
      puVar2[6] = (uint)bVar9 * auVar47._24_4_ | (uint)!bVar9 * puVar2[6];
      puVar2[7] = (uint)bVar10 * auVar47._28_4_ | (uint)!bVar10 * puVar2[7];
      puVar2[8] = (uint)(bVar19 & 1) * auVar47._32_4_ | (uint)!(bool)(bVar19 & 1) * puVar2[8];
      puVar2[9] = (uint)bVar11 * auVar47._36_4_ | (uint)!bVar11 * puVar2[9];
      puVar2[10] = (uint)bVar12 * auVar47._40_4_ | (uint)!bVar12 * puVar2[10];
      puVar2[0xb] = (uint)bVar13 * auVar47._44_4_ | (uint)!bVar13 * puVar2[0xb];
      puVar2[0xc] = (uint)bVar14 * auVar47._48_4_ | (uint)!bVar14 * puVar2[0xc];
      puVar2[0xd] = (uint)bVar15 * auVar47._52_4_ | (uint)!bVar15 * puVar2[0xd];
      puVar2[0xe] = (uint)bVar16 * auVar47._56_4_ | (uint)!bVar16 * puVar2[0xe];
      puVar2[0xf] = (uint)(bVar19 >> 7) * auVar47._60_4_ | (uint)!(bool)(bVar19 >> 7) * puVar2[0xf];
      uVar30 = uVar30 + 0x10;
    } while ((((lVar38 - lVar31) - 4U >> 2) + 0x10 & 0x7ffffffffffffff0) != uVar30);
  }
  (*(invstds->super_tensor)._vptr_tensor[3])();
  (*(local_208->super_tensor)._vptr_tensor[3])();
  (*src->_vptr_tensor[2])();
  prVar20 = local_200;
  resizable_tensor::copy_size(local_200,&invstds->super_tensor);
  iVar23 = (*(prVar20->super_tensor)._vptr_tensor[3])(prVar20);
  if (0 < src->m_k) {
    lVar38 = 0;
    dVar50 = (double)(src->m_n * lVar32);
    dVar50 = dVar50 / (dVar50 + -1.0);
    local_200 = (resizable_tensor *)(1.0 - averaging_factor);
    local_1e0 = dVar50 * averaging_factor;
    dVar58 = local_1f8;
    do {
      auVar52 = ZEXT416(*(uint *)(lVar25 + lVar38 * 4));
      auVar52 = vfnmadd213ss_fma(auVar52,auVar52,ZEXT416(*(uint *)(lVar24 + lVar38 * 4)));
      fVar49 = auVar52._0_4_;
      if ((averaging_factor != 1.0) || (NAN(averaging_factor))) {
        auVar55._0_8_ = (double)*(float *)(CONCAT44(extraout_var_10,iVar23) + lVar38 * 4);
        auVar55._8_8_ = in_XMM7_Qb;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_200;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = (double)fVar49 * local_1e0;
        auVar52 = vfmadd231sd_fma(auVar57,auVar55,auVar3);
        dVar51 = auVar52._0_8_;
      }
      else {
        dVar51 = (double)fVar49 * dVar50;
      }
      __x = (double)fVar49 + dVar58;
      *(float *)(CONCAT44(extraout_var_10,iVar23) + lVar38 * 4) = (float)dVar51;
      if (__x < 0.0) {
        dVar51 = sqrt(__x);
        dVar58 = local_1f8;
      }
      else {
        auVar53._8_8_ = 0;
        auVar53._0_8_ = __x;
        auVar52 = vsqrtsd_avx(auVar53,auVar53);
        dVar51 = auVar52._0_8_;
      }
      *(float *)(lVar24 + lVar38 * 4) = (float)(1.0 / dVar51);
      lVar38 = lVar38 + 1;
    } while (lVar38 < src->m_k);
  }
  iVar23 = (*src->_vptr_tensor[2])();
  lVar39 = CONCAT44(extraout_var_11,iVar23);
  iVar23 = (*(local_1f0->super_tensor)._vptr_tensor[3])();
  this = local_1e8;
  prVar20 = local_208;
  lVar31 = CONCAT44(extraout_var_12,iVar23);
  lVar38 = src->m_n;
  if (0 < lVar38) {
    lVar33 = src->m_k;
    lVar34 = 0;
    do {
      if (0 < lVar33) {
        lVar35 = 0;
        do {
          if (0 < lVar32) {
            lVar36 = 0;
            lVar37 = 0;
            do {
              lVar36 = lVar36 + -4;
              fVar49 = (*(float *)(lVar39 + lVar37 * 4) - *(float *)(lVar25 + lVar35 * 4)) *
                       *(float *)(lVar24 + lVar35 * 4);
              *(float *)(lVar31 + lVar37 * 4) = fVar49;
              auVar52 = vfmadd213ss_fma(ZEXT416(*(uint *)(CONCAT44(extraout_var_03,iVar21) +
                                                         lVar35 * 4)),ZEXT416((uint)fVar49),
                                        ZEXT416(*(uint *)(CONCAT44(extraout_var_04,iVar22) +
                                                         lVar35 * 4)));
              *(int *)(lVar31 + lVar37 * 4) = auVar52._0_4_;
              lVar37 = lVar37 + 1;
            } while (lVar32 - lVar37 != 0);
            lVar31 = lVar31 - lVar36;
            lVar39 = lVar39 - lVar36;
          }
          lVar35 = lVar35 + 1;
        } while (lVar35 != lVar33);
      }
      lVar34 = lVar34 + 1;
    } while (lVar34 != lVar38);
  }
  resizable_tensor::copy_size(local_1e8,&local_208->super_tensor);
  if ((averaging_factor == 1.0) && (!NAN(averaging_factor))) {
    resizable_tensor::operator=(this,prVar20);
    return;
  }
  uVar30 = (this->super_tensor).m_size;
  if (uVar30 == 0) {
    local_1c8 = 0;
    uVar40 = 0;
    uVar30 = 0;
  }
  else {
    uVar40 = (this->super_tensor).m_n;
    uVar30 = uVar30 / uVar40;
    iVar21 = (*(this->super_tensor)._vptr_tensor[2])(this);
    local_1c8 = CONCAT44(extraout_var_13,iVar21);
  }
  local_1d0 = (float)(1.0 - averaging_factor);
  local_1d8 = &local_1c8;
  uVar27 = (prVar20->super_tensor).m_size;
  local_1c0 = uVar40;
  local_1b8 = uVar30;
  local_1b0[0] = uVar30;
  if (uVar27 == 0) {
    local_228._M_dataplus._M_p = (pointer)0x0;
    uVar30 = 0;
    uVar27 = 0;
  }
  else {
    uVar30 = (prVar20->super_tensor).m_n;
    uVar27 = uVar27 / uVar30;
    iVar21 = (*(prVar20->super_tensor)._vptr_tensor[2])(prVar20);
    local_228._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_14,iVar21);
  }
  local_48 = (float)averaging_factor;
  local_50 = &local_228;
  local_38 = &local_50;
  local_40 = &local_1d8;
  local_228._M_string_length = uVar30;
  local_228.field_2._M_allocated_capacity = uVar27;
  local_228.field_2._8_8_ = uVar27;
  resizable_tensor::operator=
            (this,(matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>_>
                   *)&local_40);
  return;
}

Assistant:

void batch_normalize_conv (
            const double eps,
            resizable_tensor& dest,
            resizable_tensor& means,
            resizable_tensor& invstds,
            const double averaging_factor,
            resizable_tensor& running_means,
            resizable_tensor& running_variances,
            const tensor& src,
            const tensor& gamma, 
            const tensor& beta 
        )
        {
            DLIB_CASSERT(0 <= averaging_factor && averaging_factor <= 1, "averaging_factor: " << averaging_factor);
            DLIB_CASSERT(averaging_factor==1 || have_same_dimensions(running_means,means));
            DLIB_CASSERT(averaging_factor==1 || have_same_dimensions(running_variances,invstds));
            DLIB_CASSERT(
                src.num_samples() > 1 &&
                gamma.num_samples() == 1 && 
                beta.num_samples() == 1 && 
                gamma.nr() == 1 && 
                beta.nr() == 1 && 
                gamma.nc() == 1 && 
                beta.nc() == 1 && 
                gamma.k()  == beta.k()  && beta.k() == src.k() &&
                eps > 0, 
                "\ngamma.num_samples(): " << gamma.num_samples() << 
                "\ngamma.k():  " << gamma.k() << 
                "\ngamma.nr(): " << gamma.nr() << 
                "\ngamma.nc(): " << gamma.nc() << 
                "\nbeta.num_samples(): " << beta.num_samples() << 
                "\nbeta.k():   " << beta.k() << 
                "\nbeta.nr():  " << beta.nr() << 
                "\nbeta.nc():  " << beta.nc() << 
                "\nsrc.k():   " << src.k() << 
                "\nsrc.nr():  " << src.nr() << 
                "\nsrc.nc():  " << src.nc()  <<
                "\neps:  " << eps 
            );

            dest.copy_size(src);
            means.set_size(1, src.k());
            invstds.set_size(1, src.k());

            // first compute means and invstds
            means = 0;
            invstds = 0;
            const auto p_invstds = invstds.host();
            const auto p_means = means.host();
            const auto p_gamma = gamma.host();   
            const auto p_beta = beta.host();   
            auto p_src = src.host();
            const long num = src.nr()*src.nc();
            // compute means, and sum of squares
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long k = 0; k < src.k(); ++k)
                {
                    for (long i = 0; i < num; ++i)
                    {
                        p_means[k] += *p_src;
                        p_invstds[k] += (*p_src)*(*p_src);
                        ++p_src;
                    }
                }
            }
            means /= src.num_samples()*num;
            invstds /= src.num_samples()*num;
            // copy data back to host
            invstds.host(); means.host();

            p_src = src.host();
            // compute variances 
            running_variances.copy_size(invstds);
            auto rvar = running_variances.host();
            // This scale makes the running variances unbiased.
            const double scale = (src.num_samples()*num)/(src.num_samples()*num-1.0);
            for (long k = 0; k < src.k(); ++k)
            {
                float actual_var = p_invstds[k] - p_means[k]*p_means[k];
                if (averaging_factor == 1)
                    rvar[k] = scale*actual_var;
                else
                    rvar[k] = (1-averaging_factor)*rvar[k] + scale*averaging_factor*actual_var;

                p_invstds[k] = 1.0f/std::sqrt(actual_var + eps);
            }

            p_src = src.host();
            auto p_dest = dest.host();
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long k = 0; k < src.k(); ++k)
                {
                    for (long i = 0; i < num; ++i)
                    {
                        *p_dest = (*p_src - p_means[k])*p_invstds[k];
                        *p_dest = (*p_dest)*p_gamma[k] + p_beta[k];
                        ++p_src;
                        ++p_dest;
                    }
                }
            }

            // now keep track of the running means 
            running_means.copy_size(means);
            if (averaging_factor != 1)
                running_means = (1-averaging_factor)*mat(running_means) + averaging_factor*mat(means);
            else
                running_means = means;
        }